

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O3

int __thiscall CaDiCaL::Internal::backward_true_satisfiable(Internal *this)

{
  anon_struct_8_2_4505284c_for_terminate *paVar1;
  anon_struct_16_2_20cb3f79_for_constant_forward_backward *paVar2;
  Terminator *pTVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  
  lVar7 = (long)this->max_var;
  if (0 < (long)this->max_var) {
    do {
      if (this->termination_forced != false) {
LAB_0081bd04:
        if (0 < this->level) {
          backtrack(this,0);
        }
        iVar6 = -1;
LAB_0081bd1c:
        if (this->conflict == (Clause *)0x0) {
          return iVar6;
        }
        this->conflict = (Clause *)0x0;
        return iVar6;
      }
      iVar6 = (this->lim).terminate.forced;
      if ((iVar6 != 0) && ((this->lim).terminate.forced = iVar6 + -1, iVar6 == 1)) {
LAB_0081bcfd:
        this->termination_forced = true;
        goto LAB_0081bd04;
      }
      pTVar3 = this->external->terminator;
      if (pTVar3 != (Terminator *)0x0) {
        paVar1 = &(this->lim).terminate;
        iVar6 = paVar1->check;
        paVar1->check = paVar1->check + -1;
        if (iVar6 == 0) {
          (this->lim).terminate.check = (this->opts).terminateint * 10;
          cVar4 = (**(code **)(*(long *)pTVar3 + 0x10))();
          if (cVar4 != '\0') goto LAB_0081bcfd;
        }
      }
      if (this->vals[lVar7] == '\0') {
        search_assume_decision(this,(int)lVar7);
        bVar5 = propagate(this);
        if (!bVar5) {
          if (0 < this->level) {
            backtrack(this,0);
          }
          iVar6 = 0;
          goto LAB_0081bd1c;
        }
      }
      bVar5 = 1 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar5);
  }
  if (this->internal != (Internal *)0x0) {
    verbose(this->internal,1,"backward assuming variables true satisfies formula");
  }
  paVar2 = &(this->stats).lucky.backward;
  paVar2->one = paVar2->one + 1;
  return 10;
}

Assistant:

int Internal::backward_true_satisfiable () {
  LOG ("checking decreasing variable index true assignment");
  assert (!unsat);
  assert (!level);
  assert (assumptions.empty ());
  for (int idx = max_var; idx > 0; idx--) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (val (idx))
      continue;
    search_assume_decision (idx);
    if (!propagate ())
      return unlucky (0);
  }
  VERBOSE (1, "backward assuming variables true satisfies formula");
  assert (satisfied ());
  stats.lucky.backward.one++;
  return 10;
}